

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

bool __thiscall
density::
lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::consume_operation::start_consume_impl
          (consume_operation *this,PrivateType param_1,
          lf_heter_queue<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          *i_queue)

{
  bool bVar1;
  
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::empty(&this->m_consume_data);
  if (!bVar1) {
    LOCK();
    ((this->m_consume_data).m_control)->m_next = (this->m_consume_data).m_next_ptr - 2;
    UNLOCK();
    (this->m_consume_data).m_next_ptr = 0;
  }
  detail::
  LFQueue_Head<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  ::Consume::start_consume_impl
            (&this->m_consume_data,
             &i_queue->
              super_LFQueue_Head<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
            );
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::empty(&this->m_consume_data);
  return !bVar1;
}

Assistant:

bool start_consume_impl(PrivateType, lf_heter_queue * i_queue)
            {
                if (!m_consume_data.empty())
                {
                    m_consume_data.cancel_consume_impl();
                }

                m_consume_data.start_consume_impl(i_queue);

                return !m_consume_data.empty();
            }